

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::read_sof_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = get_bits(this,0x10);
  uVar2 = get_bits(this,8);
  if (uVar2 != 8) {
    stop_decoding(this,JPGD_BAD_PRECISION);
  }
  uVar2 = get_bits(this,0x10);
  this->m_image_y_size = uVar2;
  if (uVar2 - 0x8001 < 0xffff8000) {
    stop_decoding(this,JPGD_BAD_HEIGHT);
  }
  uVar2 = get_bits(this,0x10);
  this->m_image_x_size = uVar2;
  if (uVar2 - 0x8001 < 0xffff8000) {
    stop_decoding(this,JPGD_BAD_WIDTH);
  }
  uVar2 = get_bits(this,8);
  this->m_comps_in_frame = uVar2;
  if ((int)uVar2 < 5) {
    if (uVar1 != uVar2 * 3 + 8) {
      stop_decoding(this,JPGD_BAD_SOF_LENGTH);
    }
    if (0 < this->m_comps_in_frame) {
      lVar3 = 0;
      do {
        uVar1 = get_bits(this,8);
        this->m_comp_ident[lVar3] = uVar1;
        uVar1 = get_bits(this,4);
        this->m_comp_h_samp[lVar3] = uVar1;
        uVar1 = get_bits(this,4);
        this->m_comp_v_samp[lVar3] = uVar1;
        if ((((2 < (int)uVar1) || (2 < this->m_comp_h_samp[lVar3])) || (uVar1 == 0)) ||
           (this->m_comp_h_samp[lVar3] == 0)) {
          stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
        }
        uVar1 = get_bits(this,8);
        this->m_comp_quant[lVar3] = uVar1;
        if (3 < (int)uVar1) {
          stop_decoding(this,JPGD_DECODE_ERROR);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->m_comps_in_frame);
    }
    return;
  }
  stop_decoding(this,JPGD_TOO_MANY_COMPONENTS);
}

Assistant:

void jpeg_decoder::read_sof_marker()
	{
		int i;
		uint num_left;

		num_left = get_bits(16);

		/* precision: sorry, only 8-bit precision is supported */
		if (get_bits(8) != 8)
			stop_decoding(JPGD_BAD_PRECISION);

		m_image_y_size = get_bits(16);

		if ((m_image_y_size < 1) || (m_image_y_size > JPGD_MAX_HEIGHT))
			stop_decoding(JPGD_BAD_HEIGHT);

		m_image_x_size = get_bits(16);

		if ((m_image_x_size < 1) || (m_image_x_size > JPGD_MAX_WIDTH))
			stop_decoding(JPGD_BAD_WIDTH);

		m_comps_in_frame = get_bits(8);

		if (m_comps_in_frame > JPGD_MAX_COMPONENTS)
			stop_decoding(JPGD_TOO_MANY_COMPONENTS);

		if (num_left != (uint)(m_comps_in_frame * 3 + 8))
			stop_decoding(JPGD_BAD_SOF_LENGTH);

		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_comp_ident[i] = get_bits(8);
			m_comp_h_samp[i] = get_bits(4);
			m_comp_v_samp[i] = get_bits(4);

			if (!m_comp_h_samp[i] || !m_comp_v_samp[i] || (m_comp_h_samp[i] > 2) || (m_comp_v_samp[i] > 2))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_comp_quant[i] = get_bits(8);
			if (m_comp_quant[i] >= JPGD_MAX_QUANT_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}
	}